

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phf.cc
# Opt level: O0

int PHF::Uniq::cmp<phf_string>(phf_string_t *a,phf_string_t *b)

{
  size_t local_40;
  int cmp;
  phf_string_t *b_local;
  phf_string_t *a_local;
  
  if (a->n < b->n) {
    local_40 = a->n;
  }
  else {
    local_40 = b->n;
  }
  a_local._4_4_ = memcmp(a->p,b->p,local_40);
  if (a_local._4_4_ == 0) {
    if (b->n < a->n) {
      a_local._4_4_ = -1;
    }
    else if (a->n < b->n) {
      a_local._4_4_ = 1;
    }
    else {
      a_local._4_4_ = 0;
    }
  }
  return a_local._4_4_;
}

Assistant:

int cmp(const phf_string_t *a, const phf_string_t *b) {
			int cmp;
			if ((cmp = memcmp(a->p, b->p, PHF_MIN(a->n, b->n))))
				return cmp;
			if (a->n > b->n)
				return -1;
			if (a->n < b->n)
				return 1;
			return 0;
		}